

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashed.h
# Opt level: O1

void __thiscall wasm::FunctionHasher::doWalkFunction(FunctionHasher *this,Function *func)

{
  size_t sVar1;
  mapped_type_conflict *pmVar2;
  _Any_data local_48;
  _Manager_type local_38;
  Function *local_28;
  Function *func_local;
  
  local_28 = func;
  std::function<bool_(wasm::Expression_*,_unsigned_long_&)>::function
            ((function<bool_(wasm::Expression_*,_unsigned_long_&)> *)&local_48,&this->customHasher);
  sVar1 = flexibleHashFunction(func,(ExprHasher *)&local_48);
  pmVar2 = std::
           map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
           ::at(&this->output->
                 super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
                ,&local_28);
  *pmVar2 = sVar1;
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    output->at(func) = flexibleHashFunction(func, customHasher);
  }